

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Own<kj::ReadableFile,_std::nullptr_t> __thiscall kj::newDiskReadableFile(kj *this,OwnFd *fd)

{
  OwnFd *params;
  ReadableFile *extraout_RDX;
  Own<kj::ReadableFile,_std::nullptr_t> OVar1;
  OwnFd *local_18;
  OwnFd *fd_local;
  
  local_18 = fd;
  fd_local = (OwnFd *)this;
  params = mv<kj::OwnFd>(fd);
  heap<kj::(anonymous_namespace)::DiskReadableFile,kj::OwnFd>((kj *)&stack0xffffffffffffffd8,params)
  ;
  Own<kj::ReadableFile,decltype(nullptr)>::Own<kj::(anonymous_namespace)::DiskReadableFile,void>
            ((Own<kj::ReadableFile,decltype(nullptr)> *)this,
             (Own<kj::(anonymous_namespace)::DiskReadableFile,_std::nullptr_t> *)
             &stack0xffffffffffffffd8);
  Own<kj::(anonymous_namespace)::DiskReadableFile,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::DiskReadableFile,_std::nullptr_t> *)
             &stack0xffffffffffffffd8);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<ReadableFile> newDiskReadableFile(kj::OwnFd fd) {
  return heap<DiskReadableFile>(kj::mv(fd));
}